

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
unary_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_-1,_-1,_false>,_Eigen::internal::IndexBased,_float>
::unary_evaluator(unary_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,__1,__1,_false>,_Eigen::internal::IndexBased,_float>
                  *this,XprType *block)

{
  type *ptVar1;
  StorageIndex SVar2;
  Index IVar3;
  StorageIndex SVar4;
  XprType *block_local;
  unary_evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,__1,__1,_false>,_Eigen::internal::IndexBased,_float>
  *this_local;
  
  evaluator_base<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_-1,_-1,_false>_>
  ::evaluator_base((evaluator_base<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,__1,__1,_false>_>
                    *)this);
  ptVar1 = BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_-1,_-1,_false,_false>
           ::nestedExpression((BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,__1,__1,_false,_false>
                               *)block);
  evaluator<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>_>
  ::evaluator(&this->m_argImpl,ptVar1);
  SVar2 = BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_-1,_-1,_false,_false>
          ::startRow((BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,__1,__1,_false,_false>
                      *)block);
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startRow,SVar2);
  SVar2 = BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_-1,_-1,_false,_false>
          ::startCol((BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,__1,__1,_false,_false>
                      *)block);
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startCol,SVar2);
  SVar2 = BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_-1,_-1,_false,_false>
          ::startCol((BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,__1,__1,_false,_false>
                      *)block);
  ptVar1 = BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_-1,_-1,_false,_false>
           ::nestedExpression((BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,__1,__1,_false,_false>
                               *)block);
  IVar3 = CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>
          ::rows(ptVar1);
  SVar4 = BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>,_-1,_-1,_false,_false>
          ::startRow((BlockImpl_dense<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,__1,__1,_false,_false>
                      *)block);
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_linear_offset,SVar2 * IVar3 + SVar4);
  return;
}

Assistant:

explicit unary_evaluator(const XprType& block)
    : m_argImpl(block.nestedExpression()),
      m_startRow(block.startRow()),
      m_startCol(block.startCol()),
      m_linear_offset(ForwardLinearAccess?(ArgType::IsRowMajor ? block.startRow()*block.nestedExpression().cols() + block.startCol() : block.startCol()*block.nestedExpression().rows() + block.startRow()):0)
  { }